

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BrepTrim * __thiscall ON_BrepTrim::Duplicate(ON_BrepTrim *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[2])();
  return (ON_BrepTrim *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ON_BrepTrim::ON_BrepTrim()
{
  memset(&m_trim_user,0,sizeof(m_trim_user));
  m_vi[0] = m_vi[1] = -1; 
  m_tolerance[0] = m_tolerance[1] = ON_UNSET_VALUE;
  m_pline.Reserve(4); // This is a stopgap fix to insures the memory 
                      // pool used for pline segments is the same as
                      // the memory pool used for the rest of this brep.
  //m_P[0] = ON_3dPoint::UnsetPoint;
  //m_P[1] = ON_3dPoint::UnsetPoint;
}